

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O2

bool __thiscall
mp::VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_positive
          (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this,int i)

{
  double dVar1;
  
  if ((this->type_).data_[i] == INTEGER) {
    dVar1 = 0.5;
  }
  else {
    dVar1 = this->feastol_;
  }
  return dVar1 <= (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[i];
}

Assistant:

double operator[]( int i ) const {
    assert(i>=0 && i<(int)x_.size());
    return x_[i];
  }